

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceIncludes
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  int i;
  int index;
  string basename;
  string target_basename;
  Formatter format;
  allocator local_b9;
  string local_b8;
  Printer *local_98;
  Options *local_90;
  string local_88;
  Formatter local_68;
  
  local_98 = printer;
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  StripProto(&local_88,*(string **)this->file_);
  local_90 = &this->options_;
  if ((this->options_).opensource_runtime == false) {
    GetBootstrapBasename(local_90,&local_88,&local_88);
  }
  std::__cxx11::string::append((char *)&local_88);
  CreateHeaderInclude(&local_b8,this,&local_88,this->file_);
  Formatter::operator()
            (&local_68,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#include $1$\n\n#include <algorithm>\n\n"
             ,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"net/proto2/io/public/coded_stream.h",&local_b9);
  IncludeFile(this,&local_b8,local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"net/proto2/public/extension_set.h",&local_b9);
  IncludeFile(this,&local_b8,local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"net/proto2/public/wire_format_lite.h",&local_b9)
  ;
  IncludeFile(this,&local_b8,local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  bVar1 = UseUnknownFieldSet(this->file_,local_90);
  if ((!bVar1) &&
     ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::string
              ((string *)&local_b8,"net/proto2/io/public/zero_copy_stream_impl_lite.h",&local_b9);
    IncludeFile(this,&local_b8,local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = HasDescriptorMethods(this->file_,local_90);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_b8,"net/proto2/public/descriptor.h",&local_b9);
    IncludeFile(this,&local_b8,local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string
              ((string *)&local_b8,"net/proto2/public/generated_message_reflection.h",&local_b9);
    IncludeFile(this,&local_b8,local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string((string *)&local_b8,"net/proto2/public/reflection_ops.h",&local_b9)
    ;
    IncludeFile(this,&local_b8,local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string((string *)&local_b8,"net/proto2/public/wire_format.h",&local_b9);
    IncludeFile(this,&local_b8,local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = HasGeneratedMethods(this->file_,local_90);
  if (bVar1 && (this->options_).tctable_mode != kTCTableNever) {
    std::__cxx11::string::string
              ((string *)&local_b8,"net/proto2/public/generated_message_tctable_impl.h",&local_b9);
    IncludeFile(this,&local_b8,local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((this->options_).proto_h == true) {
    for (index = 0; pFVar2 = this->file_, index < *(int *)(pFVar2 + 0x20); index = index + 1) {
      pFVar2 = FileDescriptor::dependency(pFVar2,index);
      if (((this->options_).opensource_runtime != false) || (bVar1 = IsDepWeak(this,pFVar2), !bVar1)
         ) {
        StripProto(&local_b8,*(string **)pFVar2);
        bVar1 = IsBootstrapProto(local_90,this->file_);
        if (bVar1) {
          GetBootstrapBasename(local_90,&local_b8,&local_b8);
        }
        Formatter::operator()(&local_68,"#include \"$1$.proto.h\"\n",&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
    }
  }
  else {
    pFVar2 = this->file_;
  }
  bVar1 = HasCordFields(pFVar2,local_90);
  if (bVar1) {
    Formatter::operator()<>
              (&local_68,"#include \"third_party/absl/strings/internal/string_constant.h\"\n");
  }
  Formatter::operator()<>(&local_68,"// @@protoc_insertion_point(includes)\n");
  std::__cxx11::string::string((string *)&local_b8,"net/proto2/public/port_def.inc",&local_b9);
  IncludeFile(this,&local_b8,local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  Formatter::operator()<>(&local_68,"\nPROTOBUF_PRAGMA_INIT_SEG\n");
  std::__cxx11::string::~string((string *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSourceIncludes(io::Printer* printer) {
  Formatter format(printer, variables_);
  std::string target_basename = StripProto(file_->name());
  if (!options_.opensource_runtime) {
    GetBootstrapBasename(options_, target_basename, &target_basename);
  }
  target_basename += options_.proto_h ? ".proto.h" : ".pb.h";
  format(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n"
      "#include $1$\n"
      "\n"
      "#include <algorithm>\n"  // for swap()
      "\n",
      CreateHeaderInclude(target_basename, file_));

  IncludeFile("net/proto2/io/public/coded_stream.h", printer);
  // TODO(gerbens) This is to include parse_context.h, we need a better way
  IncludeFile("net/proto2/public/extension_set.h", printer);
  IncludeFile("net/proto2/public/wire_format_lite.h", printer);

  // Unknown fields implementation in lite mode uses StringOutputStream
  if (!UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    IncludeFile("net/proto2/io/public/zero_copy_stream_impl_lite.h", printer);
  }

  if (HasDescriptorMethods(file_, options_)) {
    IncludeFile("net/proto2/public/descriptor.h", printer);
    IncludeFile("net/proto2/public/generated_message_reflection.h", printer);
    IncludeFile("net/proto2/public/reflection_ops.h", printer);
    IncludeFile("net/proto2/public/wire_format.h", printer);
  }

  if (HasGeneratedMethods(file_, options_) &&
      options_.tctable_mode != Options::kTCTableNever) {
    IncludeFile("net/proto2/public/generated_message_tctable_impl.h", printer);
  }

  if (options_.proto_h) {
    // Use the smaller .proto.h files.
    for (int i = 0; i < file_->dependency_count(); i++) {
      const FileDescriptor* dep = file_->dependency(i);
      // Do not import weak deps.
      if (!options_.opensource_runtime && IsDepWeak(dep)) continue;
      std::string basename = StripProto(dep->name());
      if (IsBootstrapProto(options_, file_)) {
        GetBootstrapBasename(options_, basename, &basename);
      }
      format("#include \"$1$.proto.h\"\n", basename);
    }
  }
  if (HasCordFields(file_, options_)) {
    format(
        "#include \"third_party/absl/strings/internal/string_constant.h\"\n");
  }

  format("// @@protoc_insertion_point(includes)\n");
  IncludeFile("net/proto2/public/port_def.inc", printer);

  // For MSVC builds, we use #pragma init_seg to move the initialization of our
  // libraries to happen before the user code.
  // This worksaround the fact that MSVC does not do constant initializers when
  // required by the standard.
  format("\nPROTOBUF_PRAGMA_INIT_SEG\n");
}